

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUCache.hpp
# Opt level: O0

userType * __thiscall
sjtu::LRUCache<sjtu::userType>::load(LRUCache<sjtu::userType> *this,locType *offset)

{
  size_t sVar1;
  void *pvVar2;
  long lVar3;
  bool bVar4;
  CacheNode *pCVar5;
  size_t sVar6;
  value_type *pvVar7;
  CacheNode *in_RDI;
  CacheNode *tmp;
  CacheNode *node;
  iterator it;
  map<long,_sjtu::LRUCache<sjtu::userType>::CacheNode_*,_std::less<long>_>
  *in_stack_ffffffffffffff18;
  map<long,_sjtu::LRUCache<sjtu::userType>::CacheNode_*,_std::less<long>_>
  *in_stack_ffffffffffffff28;
  locType *in_stack_ffffffffffffff38;
  LRUCache<sjtu::userType> *in_stack_ffffffffffffff40;
  LRUCache<sjtu::userType> *in_stack_ffffffffffffff58;
  locType *in_stack_ffffffffffffff60;
  userType *in_stack_ffffffffffffff68;
  CacheNode *in_stack_ffffffffffffff70;
  iterator local_38;
  CacheNode *local_28;
  iterator local_20 [2];
  
  *(int *)((in_RDI->value).username + 0x10) = *(int *)((in_RDI->value).username + 0x10) + 1;
  map<long,_sjtu::LRUCache<sjtu::userType>::CacheNode_*,_std::less<long>_>::find
            (in_stack_ffffffffffffff28,(long *)in_RDI);
  map<long,_sjtu::LRUCache<sjtu::userType>::CacheNode_*,_std::less<long>_>::end
            (in_stack_ffffffffffffff18);
  bVar4 = map<long,_sjtu::LRUCache<sjtu::userType>::CacheNode_*,_std::less<long>_>::iterator::
          operator==(local_20,&local_38);
  if (bVar4) {
    *(int *)((in_RDI->value).username + 0x14) = *(int *)((in_RDI->value).username + 0x14) + 1;
    pCVar5 = (CacheNode *)operator_new(0xb0);
    f_read(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    CacheNode::CacheNode
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58);
    sVar1 = *(size_t *)((in_RDI->value).username + 8);
    local_28 = pCVar5;
    sVar6 = map<long,_sjtu::LRUCache<sjtu::userType>::CacheNode_*,_std::less<long>_>::size
                      ((map<long,_sjtu::LRUCache<sjtu::userType>::CacheNode_*,_std::less<long>_> *)
                       ((in_RDI->value).password + 0x13));
    if (sVar1 == sVar6) {
      pvVar2 = *(void **)((in_RDI->value).password + 0xb);
      lVar3 = *(long *)(*(long *)((in_RDI->value).password + 0xb) + 0x98);
      *(long *)((in_RDI->value).password + 0xb) = lVar3;
      if (lVar3 == 0) {
        (in_RDI->value).password[3] = '\0';
        (in_RDI->value).password[4] = '\0';
        (in_RDI->value).password[5] = '\0';
        (in_RDI->value).password[6] = '\0';
        (in_RDI->value).password[7] = '\0';
        (in_RDI->value).password[8] = '\0';
        (in_RDI->value).password[9] = '\0';
        (in_RDI->value).password[10] = '\0';
      }
      else {
        *(undefined8 *)(*(long *)((in_RDI->value).password + 0xb) + 0xa0) = 0;
      }
      if (pvVar2 != (void *)0x0) {
        CacheNode::~CacheNode(in_RDI);
        operator_delete(pvVar2,0xb0);
      }
    }
    if (*(long *)((in_RDI->value).password + 3) == 0) {
      *(CacheNode **)((in_RDI->value).password + 0xb) = local_28;
      *(CacheNode **)((in_RDI->value).password + 3) = local_28;
    }
    else {
      pCVar5 = *(CacheNode **)((in_RDI->value).password + 3);
      local_28->succ = pCVar5;
      pCVar5->prec = local_28;
      *(CacheNode **)((in_RDI->value).password + 3) = local_28;
    }
  }
  else {
    pvVar7 = map<long,_sjtu::LRUCache<sjtu::userType>::CacheNode_*,_std::less<long>_>::iterator::
             operator->(local_20);
    local_28 = pvVar7->second;
    if (local_28 != *(CacheNode **)((in_RDI->value).password + 3)) {
      local_28->prec->succ = local_28->succ;
      if (local_28->succ == (CacheNode *)0x0) {
        *(CacheNode **)((in_RDI->value).password + 0xb) = local_28->prec;
      }
      else {
        local_28->succ->prec = local_28->prec;
      }
      local_28->prec = (CacheNode *)0x0;
      pCVar5 = *(CacheNode **)((in_RDI->value).password + 3);
      local_28->succ = pCVar5;
      pCVar5->prec = local_28;
      *(CacheNode **)((in_RDI->value).password + 3) = local_28;
    }
  }
  return &local_28->value;
}

Assistant:

valueType *load(const locType &offset)
		{
			++ attempt_count;
			typename map<locType , CacheNode*>::iterator it = table.find(offset);
			CacheNode *node;
			if (it == table.end())
			{
				++ miss_count;
				node = new CacheNode (f_read(offset) , offset , this);
				if (block_lim == table.size())
				{
					CacheNode *tmp = tail;
					if (tail = tail -> prec) tail -> succ = nullptr;
					else  head = nullptr;
					delete tmp;
				}
				if (head == nullptr) head = tail = node;
				else (node -> succ = head) -> prec = node , head = node;
			}
			else
			{
				node = it -> second;
				if (node != head)
				{
					node -> prec -> succ = node -> succ;
					if (node -> succ) node -> succ -> prec = node -> prec;
					else tail = node -> prec;
					node -> prec = nullptr , (node -> succ = head) -> prec = node , head = node;
				}
			}
			return &(node -> value);
		}